

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlainObjectBase.h
# Opt level: O0

Matrix<double,_1,_3,_1,_1,_3> * __thiscall
Eigen::PlainObjectBase<Eigen::Matrix<double,1,3,1,1,3>>::
_set_noalias<Eigen::Matrix<double,3,1,0,3,1>>
          (PlainObjectBase<Eigen::Matrix<double,1,3,1,1,3>> *this,
          DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *other)

{
  Matrix<double,_1,_3,_1,_1,_3> *pMVar1;
  Matrix<double,_3,_1,_0,_3,_1> *src;
  assign_op<double,_double> local_19;
  EigenBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *local_18;
  DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *other_local;
  PlainObjectBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_> *this_local;
  
  local_18 = (EigenBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)other;
  other_local = (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)this;
  pMVar1 = EigenBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>::derived
                     ((EigenBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_> *)this);
  src = EigenBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::derived(local_18);
  internal::assign_op<double,_double>::assign_op(&local_19);
  internal::
  call_assignment_no_alias<Eigen::Matrix<double,1,3,1,1,3>,Eigen::Matrix<double,3,1,0,3,1>,Eigen::internal::assign_op<double,double>>
            (pMVar1,src,&local_19);
  pMVar1 = EigenBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_>::derived
                     ((EigenBase<Eigen::Matrix<double,_1,_3,_1,_1,_3>_> *)this);
  return pMVar1;
}

Assistant:

EIGEN_DEVICE_FUNC
    EIGEN_STRONG_INLINE Derived& _set_noalias(const DenseBase<OtherDerived>& other)
    {
      // I don't think we need this resize call since the lazyAssign will anyways resize
      // and lazyAssign will be called by the assign selector.
      //_resize_to_match(other);
      // the 'false' below means to enforce lazy evaluation. We don't use lazyAssign() because
      // it wouldn't allow to copy a row-vector into a column-vector.
      internal::call_assignment_no_alias(this->derived(), other.derived(), internal::assign_op<Scalar,typename OtherDerived::Scalar>());
      return this->derived();
    }